

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clMemFreeINTEL(cl_context context,void *ptr)

{
  atomic<unsigned_long> *paVar1;
  ulong enqueueCounter;
  CLIntercept *this;
  byte bVar2;
  cl_int errorCode;
  CLdispatchX *pCVar3;
  time_point end;
  allocator local_59;
  time_point local_58;
  string local_50;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x22;
  }
  pCVar3 = CLIntercept::dispatchX(g_pIntercept,context);
  if (pCVar3->clMemFreeINTEL == (_func_cl_int_cl_context_void_ptr *)0x0) {
    return -0x22;
  }
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (this,"clMemFreeINTEL",enqueueCounter,(cl_kernel)0x0,"context = %p, ptr = %p",context,
               ptr);
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_58.__d.__r = (duration)0;
  }
  else {
    local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pCVar3->clMemFreeINTEL)(context,ptr);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_50,"",&local_59);
      CLIntercept::updateHostTimingStats(this,"clMemFreeINTEL",&local_50,local_58,end);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((ptr != (void *)0x0) &&
     (((((this->m_Config).DumpBuffersBeforeEnqueue != false ||
        ((this->m_Config).DumpBuffersAfterEnqueue != false)) ||
       ((this->m_Config).InjectBuffers != false)) ||
      (((this->m_Config).InjectImages != false || ((this->m_Config).CaptureReplay == true)))))) {
    CLIntercept::removeUSMAllocation(this,ptr);
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((bool)bVar2 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_00134ddf;
    }
    else if (errorCode == 0) goto LAB_00134db6;
  }
  else {
    if (errorCode == 0) {
LAB_00134db6:
      errorCode = 0;
      goto LAB_00134ddf;
    }
    CLIntercept::logError(this,"clMemFreeINTEL",errorCode);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_00134ddf:
  if ((ptr != (void *)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    paVar1 = &(this->m_ObjectTracker).m_Pointers.NumFrees;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clMemFreeINTEL",errorCode,(cl_event *)0x0,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_50,"",&local_59);
    CLIntercept::chromeCallLoggingExit(this,"clMemFreeINTEL",&local_50,false,0,local_58,end);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clMemFreeINTEL(
    cl_context context,
    void* ptr)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clMemFreeINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER( "context = %p, ptr = %p",
                context,
                ptr );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clMemFreeINTEL(
                context,
                ptr );

            HOST_PERFORMANCE_TIMING_END();
            REMOVE_USM_ALLOCATION( ptr );
            CHECK_ERROR( retVal );
            ADD_POINTER_FREE( ptr );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_CONTEXT);
}